

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
waitGLResults(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
              *this)

{
  RenderContext *context;
  Surface dummySurface;
  TextureFormat local_58;
  Surface local_50;
  PixelBufferAccess local_38;
  
  tcu::Surface::Surface(&local_50,0x20,0x20);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_58.order = RGBA;
  local_58.type = UNORM_INT8;
  if ((void *)local_50.m_pixels.m_cap != (void *)0x0) {
    local_50.m_pixels.m_cap = (size_t)local_50.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_38,&local_58,local_50.m_width,local_50.m_height,1,
             (void *)local_50.m_pixels.m_cap);
  glu::readPixels(context,0,0,&local_38);
  tcu::Surface::~Surface(&local_50);
  return;
}

Assistant:

void BasicBufferCase<SampleType>::waitGLResults (void)
{
	tcu::Surface dummySurface(DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
	glu::readPixels(m_context.getRenderContext(), 0, 0, dummySurface.getAccess());
}